

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emu2212.c
# Opt level: O2

void internal_refresh(PSG *psg)

{
  e_uint32 eVar1;
  
  if (psg->quality == 0) {
    eVar1 = (e_uint32)(long)(((double)psg->clk * 16777216.0) / (double)(psg->rate << 4));
  }
  else {
    psg->realstep = (e_uint32)(0x80000000 / (ulong)psg->rate);
    psg->psgstep = (e_uint32)(0x80000000 / (ulong)(psg->clk >> 4));
    psg->psgtime = 0;
    eVar1 = 0x1000000;
  }
  psg->base_incr = eVar1;
  return;
}

Assistant:

static void
internal_refresh (SCC * scc)
{
  if (scc->quality)
  {
    scc->base_incr = 2 << GETA_BITS;
    scc->realstep = (e_uint32) ((1 << 31) / scc->rate);
    scc->sccstep = (e_uint32) ((1 << 31) / (scc->clk / 2));
    scc->scctime = 0;
  }
  else
  {
    scc->base_incr = (e_uint32) ((double) scc->clk * (1 << GETA_BITS) / scc->rate);
  }
}